

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O3

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>const,1,-1,true>>,3,0>
       ::run<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>const,1,_1,true>>
                 (redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                  *eval,scalar_sum_op<double,_double> *func,
                 Block<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *xpr)

{
  PointerType pdVar1;
  ulong uVar2;
  PointerType pdVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  pdVar1 = (xpr->
           super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
           ).
           super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>
           .m_data;
  uVar2 = (xpr->
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
          ).super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>
          .m_cols.m_value;
  uVar4 = uVar2;
  if ((((ulong)pdVar1 & 7) == 0) &&
     (uVar4 = (ulong)((uint)((ulong)pdVar1 >> 3) & 1), (long)uVar2 <= (long)uVar4)) {
    uVar4 = uVar2;
  }
  uVar8 = uVar2 - uVar4;
  uVar7 = uVar8 + 3;
  if (-1 < (long)uVar8) {
    uVar7 = uVar8;
  }
  pdVar3 = (eval->
           super_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
           ).
           super_block_evaluator<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>.
           super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
           .m_data;
  if (uVar8 + 1 < 3) {
    dVar10 = *pdVar3;
    if (1 < (long)uVar2) {
      uVar4 = 1;
      do {
        dVar10 = dVar10 + pdVar3[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
  }
  else {
    uVar5 = uVar8 - ((long)uVar8 >> 0x3f) & 0xfffffffffffffffe;
    dVar13 = pdVar3[uVar4];
    dVar10 = (pdVar3 + uVar4)[1];
    if (3 < (long)uVar8) {
      lVar6 = (uVar7 & 0xfffffffffffffffc) + uVar4;
      dVar11 = pdVar3[uVar4 + 2];
      dVar12 = (pdVar3 + uVar4 + 2)[1];
      if (7 < uVar8) {
        lVar9 = uVar4 + 4;
        do {
          dVar13 = dVar13 + pdVar3[lVar9];
          dVar10 = dVar10 + (pdVar3 + lVar9)[1];
          dVar11 = dVar11 + pdVar3[lVar9 + 2];
          dVar12 = dVar12 + (pdVar3 + lVar9 + 2)[1];
          lVar9 = lVar9 + 4;
        } while (lVar9 < lVar6);
      }
      dVar13 = dVar11 + dVar13;
      dVar10 = dVar12 + dVar10;
      if ((long)(uVar7 & 0xfffffffffffffffc) < (long)uVar5) {
        dVar13 = dVar13 + pdVar3[lVar6];
        dVar10 = dVar10 + (pdVar3 + lVar6)[1];
      }
    }
    lVar6 = uVar5 + uVar4;
    dVar10 = dVar10 + dVar13;
    if (0 < (long)uVar4) {
      uVar7 = 0;
      do {
        dVar10 = dVar10 + pdVar3[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    for (; lVar6 < (long)uVar2; lVar6 = lVar6 + 1) {
      dVar10 = dVar10 + pdVar3[lVar6];
    }
  }
  return dVar10;
}

Assistant:

static Scalar run(const Evaluator &eval, const Func& func, const XprType& xpr)
  {
    const Index size = xpr.size();
    
    const Index packetSize = redux_traits<Func, Evaluator>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Evaluator::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Evaluator::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(xpr);
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = eval.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = eval.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, eval.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,eval.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,eval.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = eval.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,eval.coeff(index));
    }

    return res;
  }